

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction.cc
# Opt level: O0

void __thiscall
sptk::AperiodicityExtraction::AperiodicityExtraction
          (AperiodicityExtraction *this,int fft_length,int frame_shift,double sampling_rate,
          Algorithms algorithm)

{
  void *pvVar1;
  int in_ECX;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  *in_RDI = &PTR__AperiodicityExtraction_00147be0;
  if (in_ECX == 0) {
    iVar2 = in_ECX;
    pvVar1 = operator_new(0x20);
    AperiodicityExtractionByTandem::AperiodicityExtractionByTandem
              ((AperiodicityExtractionByTandem *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               (double)CONCAT44(in_stack_ffffffffffffffd4,in_ECX));
    in_RDI[1] = pvVar1;
  }
  else if (in_ECX == 1) {
    iVar2 = in_ECX;
    pvVar1 = operator_new(0x20);
    AperiodicityExtractionByWorld::AperiodicityExtractionByWorld
              ((AperiodicityExtractionByWorld *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               (double)CONCAT44(in_stack_ffffffffffffffd4,in_ECX));
    in_RDI[1] = pvVar1;
  }
  else {
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

AperiodicityExtraction::AperiodicityExtraction(
    int fft_length, int frame_shift, double sampling_rate,
    AperiodicityExtraction::Algorithms algorithm) {
  switch (algorithm) {
    case kTandem: {
      aperiodicity_extraction_ = new AperiodicityExtractionByTandem(
          fft_length, frame_shift, sampling_rate);
      break;
    }
    case kWorld: {
      aperiodicity_extraction_ = new AperiodicityExtractionByWorld(
          fft_length, frame_shift, sampling_rate);
      break;
    }
    default: {
      aperiodicity_extraction_ = NULL;
      break;
    }
  }
}